

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.cpp
# Opt level: O0

int fmt::v6::internal::format_float<double>
              (char *buf,size_t size,char *format,int precision,double value)

{
  uint in_ECX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  undefined8 in_XMM0_Qa;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  int local_34;
  
  if ((int)in_ECX < 0) {
    local_34 = snprintf(in_RDI,in_RSI,in_RDX,in_XMM0_Qa,snprintf);
  }
  else {
    local_34 = snprintf(in_RDI,in_RSI,in_RDX,in_XMM0_Qa,(ulong)in_ECX,snprintf);
  }
  return local_34;
}

Assistant:

int format_float(char* buf, std::size_t size, const char* format, int precision,
                             T value) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                if (precision > 100000)
    throw std::runtime_error(
        "fuzz mode - avoid large allocation inside snprintf");
#endif
                // Suppress the warning about nonliteral format string.
                auto snprintf_ptr = FMT_SNPRINTF;
                return precision < 0 ? snprintf_ptr(buf, size, format, value)
                                     : snprintf_ptr(buf, size, format, precision, value);
            }